

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbolsToAdopt,
          UNumberFormatStyle style,UErrorCode *status)

{
  UErrorCode UVar1;
  DecimalFormatProperties *pDVar2;
  CurrencyPluralInfo *pCVar3;
  CurrencyPluralInfo *this_00;
  IgnoreRounding ignoreRounding;
  Locale LStack_108;
  
  DecimalFormat(this,symbolsToAdopt,status);
  if ((style < UNUM_FORMAT_STYLE_COUNT) &&
     ((0x13c04U >> (style & (UNUM_CURRENCY_STANDARD|UNUM_DECIMAL_COMPACT_LONG)) & 1) != 0)) {
    if (U_ZERO_ERROR < *status) goto LAB_00245f74;
    ignoreRounding = IGNORE_ROUNDING_ALWAYS;
  }
  else {
    if (U_ZERO_ERROR < *status) goto LAB_00245f74;
    ignoreRounding = IGNORE_ROUNDING_IF_CURRENCY;
  }
  symbolsToAdopt =
       (DecimalFormatSymbols *)
       (this->fields->properties).
       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  icu_63::number::impl::PatternParser::parseToExistingProperties
            (pattern,(DecimalFormatProperties *)symbolsToAdopt,ignoreRounding,status);
LAB_00245f74:
  if (style == UNUM_CURRENCY_PLURAL) {
    this_00 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)symbolsToAdopt);
    if (this_00 == (CurrencyPluralInfo *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      this_00 = (CurrencyPluralInfo *)0x0;
    }
    else {
      Locale::Locale(&LStack_108,
                     &((this->fields->symbols).
                       super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr)->locale);
      CurrencyPluralInfo::CurrencyPluralInfo(this_00,&LStack_108,status);
      Locale::~Locale(&LStack_108);
    }
    UVar1 = *status;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      pDVar2 = (this->fields->properties).
               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
      pCVar3 = (pDVar2->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.
               ptr;
      if (pCVar3 != (CurrencyPluralInfo *)0x0) {
        (*(pCVar3->super_UObject)._vptr_UObject[1])();
      }
      (pDVar2->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr =
           this_00;
      this_00 = (CurrencyPluralInfo *)0x0;
    }
    if (this_00 != (CurrencyPluralInfo *)0x0) {
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
    if (U_ZERO_ERROR < UVar1) {
      return;
    }
  }
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, DecimalFormatSymbols* symbolsToAdopt,
                             UNumberFormatStyle style, UErrorCode& status)
        : DecimalFormat(symbolsToAdopt, status) {
    // If choice is a currency type, ignore the rounding information.
    if (style == UNumberFormatStyle::UNUM_CURRENCY || style == UNumberFormatStyle::UNUM_CURRENCY_ISO ||
        style == UNumberFormatStyle::UNUM_CURRENCY_ACCOUNTING ||
        style == UNumberFormatStyle::UNUM_CASH_CURRENCY ||
        style == UNumberFormatStyle::UNUM_CURRENCY_STANDARD ||
        style == UNumberFormatStyle::UNUM_CURRENCY_PLURAL) {
        setPropertiesFromPattern(pattern, IGNORE_ROUNDING_ALWAYS, status);
    } else {
        setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    }
    // Note: in Java, CurrencyPluralInfo is set in NumberFormat.java, but in C++, it is not set there,
    // so we have to set it here.
    if (style == UNumberFormatStyle::UNUM_CURRENCY_PLURAL) {
        LocalPointer<CurrencyPluralInfo> cpi(
                new CurrencyPluralInfo(fields->symbols->getLocale(), status),
                status);
        if (U_FAILURE(status)) { return; }
        fields->properties->currencyPluralInfo.fPtr.adoptInstead(cpi.orphan());
    }
    touch(status);
}